

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O0

void __thiscall
GrcManager::MinAndMaxGlyphAttrValues
          (GrcManager *this,int nAttrID,int cJLevels,int nAttrIdJStr,int nAttrIdJShr,
          int nAttrIdJStep,int nAttrIdJWeight,int nAttrIdSkipPasses,int *pnMin,int *pnMax)

{
  int nAttrIdJStep_local;
  int nAttrIdJShr_local;
  int nAttrIdJStr_local;
  int cJLevels_local;
  int nAttrID_local;
  GrcManager *this_local;
  
  *pnMin = -0x8000;
  *pnMax = 0x8000;
  if ((nAttrID < nAttrIdJStr) || (nAttrIdJStr + cJLevels <= nAttrID)) {
    if ((nAttrID < nAttrIdJShr) || (nAttrIdJShr + cJLevels <= nAttrID)) {
      if ((nAttrID < nAttrIdJStep) || (nAttrIdJStep + cJLevels <= nAttrID)) {
        if ((nAttrID < nAttrIdJWeight) || (nAttrIdJWeight + cJLevels <= nAttrID)) {
          if (nAttrIdSkipPasses == nAttrID) {
            *pnMin = -1;
            *pnMax = 0x10000;
          }
        }
        else {
          *pnMin = 0;
          *pnMax = 0xff;
        }
      }
      else {
        *pnMin = -1;
      }
    }
    else {
      *pnMin = -1;
    }
  }
  else {
    *pnMin = -1;
    *pnMax = 0x40000000;
  }
  return;
}

Assistant:

void GrcManager::MinAndMaxGlyphAttrValues(int nAttrID,
	int cJLevels, int nAttrIdJStr, int nAttrIdJShr, int nAttrIdJStep, int nAttrIdJWeight,
	int nAttrIdSkipPasses,
	int * pnMin, int * pnMax)
{
	*pnMin = kMinGlyphAttrValue;
	*pnMax = kMaxGlyphAttrValue;
	if (nAttrIdJStr <= nAttrID && nAttrID < nAttrIdJStr + cJLevels)
	{
		//	justify.stretch
		*pnMin = -1;
		*pnMax = 0x40000000;
	}
	else if (nAttrIdJShr <= nAttrID && nAttrID < nAttrIdJShr + cJLevels)
	{
		//	justify.shrink
		*pnMin = -1;
	}
	else if (nAttrIdJStep <= nAttrID && nAttrID < nAttrIdJStep + cJLevels)
	{
		//	justify.step
		*pnMin = -1;
	}
	else if (nAttrIdJWeight <= nAttrID && nAttrID < nAttrIdJWeight + cJLevels)
	{
		//	justify.weight
		*pnMin = 0;
		*pnMax = 255;
	}
	else if (nAttrIdSkipPasses == nAttrID)
	{
		*pnMin = -1;
		*pnMax = 0x10000; // 1 + actual max=0xFFFF (since test is >= )
	}
}